

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O3

void __thiscall ProcessorGenerator::generate_factory(ProcessorGenerator *this)

{
  string *psVar1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  t_cpp_generator *ptVar5;
  int iVar6;
  ostream *poVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  string if_factory_name;
  string local_d0;
  char *local_b0;
  long local_a8;
  char local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  local_b0 = local_a0;
  pcVar4 = (this->if_name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar4,pcVar4 + (this->if_name_)._M_string_length);
  std::__cxx11::string::append((char *)&local_b0);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->f_header_,(this->template_header_)._M_dataplus._M_p,
                      (this->template_header_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"class ",6);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->factory_class_name_)._M_dataplus._M_p,
                      (this->factory_class_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," : public ::apache::thrift::",0x1c);
  psVar1 = &this->style_;
  iVar6 = std::__cxx11::string::compare((char *)psVar1);
  pcVar9 = "TProcessorFactory";
  if (iVar6 == 0) {
    pcVar9 = "async::TAsyncProcessorFactory";
  }
  lVar8 = 0x11;
  if (iVar6 == 0) {
    lVar8 = 0x1d;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar9,lVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," {",2);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," public:",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  ptVar5 = this->generator_;
  piVar2 = &(ptVar5->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  poVar7 = this->f_header_;
  t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)ptVar5);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->factory_class_name_)._M_dataplus._M_p,
                      (this->factory_class_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(const ::std::shared_ptr< ",0x1a);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_b0,local_a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," >& handlerFactory) noexcept :",0x1e);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this->generator_);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"    handlerFactory_(handlerFactory) {}",0x26);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this->generator_);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"::std::shared_ptr< ::apache::thrift::",0x25);
  iVar6 = std::__cxx11::string::compare((char *)psVar1);
  pcVar10 = "TProcessor";
  pcVar9 = "TProcessor";
  if (iVar6 == 0) {
    pcVar9 = "async::TAsyncProcessor";
  }
  lVar8 = 10;
  if (iVar6 == 0) {
    lVar8 = 0x16;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar9,lVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," > ",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"getProcessor(const ::apache::thrift::TConnectionInfo& connInfo) override;",0x49
            );
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  paVar3 = &local_d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->f_header_,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," protected:",0xb);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this->generator_);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"::std::shared_ptr< ",0x13);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_b0,local_a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," > handlerFactory_;",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  piVar2 = &(this->generator_->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  poVar7 = this->f_header_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"};",2);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (this->generator_->gen_templates_ == true) {
    poVar7 = this->f_header_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"typedef ",8);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(this->factory_class_name_)._M_dataplus._M_p,
                        (this->factory_class_name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"< ::apache::thrift::protocol::TDummyProtocol > ",0x2f);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(this->service_name_)._M_dataplus._M_p,
                        (this->service_name_)._M_string_length);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(this->pstyle_)._M_dataplus._M_p,(this->pstyle_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"ProcessorFactory;",0x11);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->f_out_,(this->template_header_)._M_dataplus._M_p,
                      (this->template_header_)._M_string_length);
  t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this->generator_);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"::std::shared_ptr< ::apache::thrift::",0x25);
  iVar6 = std::__cxx11::string::compare((char *)psVar1);
  pcVar9 = "TProcessor";
  if (iVar6 == 0) {
    pcVar9 = "async::TAsyncProcessor";
  }
  lVar8 = 10;
  if (iVar6 == 0) {
    lVar8 = 0x16;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar9,lVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," > ",3);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->factory_class_name_)._M_dataplus._M_p,
                      (this->factory_class_name_)._M_string_length);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->template_suffix_)._M_dataplus._M_p,
                      (this->template_suffix_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"::getProcessor(",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"const ::apache::thrift::TConnectionInfo& connInfo) {",0x34);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  ptVar5 = this->generator_;
  piVar2 = &(ptVar5->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  poVar7 = this->f_out_;
  t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)ptVar5);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"::apache::thrift::ReleaseHandler< ",0x22);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_b0,local_a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," > cleanup(handlerFactory_);",0x1c);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this->generator_);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"::std::shared_ptr< ",0x13);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->if_name_)._M_dataplus._M_p,(this->if_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," > handler(",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"handlerFactory_->getHandler(connInfo), cleanup);",0x30);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this->generator_);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"::std::shared_ptr< ::apache::thrift::",0x25);
  iVar6 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar6 == 0) {
    pcVar10 = "async::TAsyncProcessor";
  }
  lVar8 = 10;
  if (iVar6 == 0) {
    lVar8 = 0x16;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar10,lVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," > ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"processor(new ",0xe);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->class_name_)._M_dataplus._M_p,
                      (this->class_name_)._M_string_length);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->template_suffix_)._M_dataplus._M_p,
                      (this->template_suffix_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(handler));",0xb);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this->generator_);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"return processor;",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  ptVar5 = this->generator_;
  piVar2 = &(ptVar5->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  poVar7 = this->f_out_;
  t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)ptVar5);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  return;
}

Assistant:

void ProcessorGenerator::generate_factory() {
  string if_factory_name = if_name_ + "Factory";

  // Generate the factory class definition
  f_header_ << template_header_ << "class " << factory_class_name_ << " : public ::apache::thrift::"
            << (style_ == "Cob" ? "async::TAsyncProcessorFactory" : "TProcessorFactory") << " {"
            << endl << " public:" << endl;
  indent_up();

  f_header_ << indent() << factory_class_name_ << "(const ::std::shared_ptr< " << if_factory_name
            << " >& handlerFactory) noexcept :" << endl << indent()
            << "    handlerFactory_(handlerFactory) {}" << endl << endl << indent()
            << "::std::shared_ptr< ::apache::thrift::"
            << (style_ == "Cob" ? "async::TAsyncProcessor" : "TProcessor") << " > "
            << "getProcessor(const ::apache::thrift::TConnectionInfo& connInfo) override;"
            << endl;

  f_header_ << endl << " protected:" << endl << indent() << "::std::shared_ptr< "
            << if_factory_name << " > handlerFactory_;" << endl;

  indent_down();
  f_header_ << "};" << endl << endl;

  // If we are generating templates, output a typedef for the plain
  // factory name.
  if (generator_->gen_templates_) {
    f_header_ << "typedef " << factory_class_name_
              << "< ::apache::thrift::protocol::TDummyProtocol > " << service_name_ << pstyle_
              << "ProcessorFactory;" << endl << endl;
  }

  // Generate the getProcessor() method
  f_out_ << template_header_ << indent() << "::std::shared_ptr< ::apache::thrift::"
         << (style_ == "Cob" ? "async::TAsyncProcessor" : "TProcessor") << " > "
         << factory_class_name_ << template_suffix_ << "::getProcessor("
         << "const ::apache::thrift::TConnectionInfo& connInfo) {" << endl;
  indent_up();

  f_out_ << indent() << "::apache::thrift::ReleaseHandler< " << if_factory_name
         << " > cleanup(handlerFactory_);" << endl << indent() << "::std::shared_ptr< "
         << if_name_ << " > handler("
         << "handlerFactory_->getHandler(connInfo), cleanup);" << endl << indent()
         << "::std::shared_ptr< ::apache::thrift::"
         << (style_ == "Cob" ? "async::TAsyncProcessor" : "TProcessor") << " > "
         << "processor(new " << class_name_ << template_suffix_ << "(handler));" << endl << indent()
         << "return processor;" << endl;

  indent_down();
  f_out_ << indent() << "}" << endl << endl;
}